

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_function_args_abi_cxx11_
          (CompilerMSL *this,TextureFunctionArguments *args,bool *p_forward)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  ulong uVar5;
  SPIRType *type_00;
  SPIRType *type_01;
  CompilerError *pCVar6;
  _Hash_node_base *in_RCX;
  BaseType target_type;
  bool local_136f;
  bool local_136d;
  bool local_1365;
  bool local_1363;
  bool local_1361;
  bool local_132f;
  bool local_132d;
  bool local_132b;
  bool local_1329;
  bool local_12fd;
  bool local_12fb;
  bool local_12ea;
  bool local_12d9;
  bool local_12cc;
  bool local_12a6;
  TypedID *local_1298;
  undefined1 local_1260 [32];
  undefined1 local_1240 [64];
  string local_1200 [32];
  undefined1 local_11e0 [64];
  string local_11a0 [32];
  undefined1 local_1180 [64];
  undefined1 local_1140 [32];
  undefined1 local_1120 [40];
  string offset_expr;
  undefined1 local_10e0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a0 [38];
  char local_107a;
  allocator local_1079;
  string local_1078 [38];
  char local_1052;
  allocator local_1051;
  string local_1050 [32];
  undefined1 local_1030 [32];
  undefined1 local_1010 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f50 [32];
  string local_f30 [8];
  string grad_opt;
  undefined1 local_f10 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed0 [32];
  undefined1 local_eb0 [64];
  undefined1 local_e70 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e30 [38];
  char local_e0a;
  allocator local_e09;
  string local_e08 [38];
  char local_de2;
  allocator local_de1;
  string local_de0 [38];
  bool local_dba;
  bool local_db9;
  undefined1 local_db8 [6];
  bool constant_zero_y;
  bool constant_zero_x;
  undefined1 local_d98 [32];
  undefined1 local_d78 [32];
  undefined1 local_d58 [64];
  string local_d18 [8];
  string dref_expr;
  SPIRType *dref_type;
  undefined1 local_cd0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90 [32];
  undefined1 local_c70 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30 [32];
  undefined1 local_c10 [32];
  undefined1 local_bf0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0 [32];
  undefined1 local_b90 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50 [32];
  undefined1 local_b30 [32];
  undefined1 local_b10 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90 [32];
  undefined1 local_a70 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30 [32];
  string local_a10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0 [32];
  undefined1 local_9d0 [64];
  undefined1 local_990 [32];
  undefined1 local_970 [64];
  undefined1 local_930 [64];
  undefined1 local_8f0 [64];
  SPIRType *local_8b0;
  SPIRType *type_1;
  string local_888 [32];
  undefined1 local_868 [64];
  __node_base local_828;
  SPIRType *type;
  undefined1 local_800 [64];
  string local_7c0 [32];
  undefined1 local_7a0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760 [32];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0 [32];
  undefined1 local_6a0 [64];
  undefined1 local_660 [64];
  undefined1 local_620 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0 [32];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0 [32];
  string local_4a0 [32];
  undefined1 local_480 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440 [32];
  string local_420 [32];
  undefined1 local_400 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0 [32];
  undefined1 local_3a0 [64];
  string local_360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340 [32];
  string local_320 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300 [32];
  undefined1 local_2e0 [64];
  undefined1 local_2a0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [32];
  undefined1 local_240 [72];
  string local_1f8 [4];
  uint32_t alt_coord_component;
  string tex_coords;
  bool is_cube_fetch;
  bool coord_is_fp;
  SPIRType *coord_type;
  string coord_expr;
  undefined1 local_1a8 [64];
  undefined1 local_168 [64];
  undefined1 local_128 [32];
  undefined1 local_108 [40];
  SPIRCombinedImageSampler *combined;
  spirv_cross local_c0 [36];
  AddressingModel local_9c;
  undefined1 local_98 [4];
  uint32_t i;
  undefined1 local_66;
  undefined1 local_65;
  TypedID<(spirv_cross::Types)2> local_64;
  bool forward;
  undefined8 uStack_60;
  SPIRVariable *var;
  __node_base _Stack_50;
  bool is_dynamic_img_sampler;
  MSLConstexprSampler *constexpr_sampler;
  uint32_t bias;
  uint32_t grad_y;
  uint32_t grad_x;
  uint32_t lod;
  SPIRType *imgtype;
  undefined1 auStack_28 [4];
  VariableID img;
  bool *p_forward_local;
  TextureFunctionArguments *args_local;
  CompilerMSL *this_local;
  string *farg_str;
  
  imgtype._4_4_ = *(undefined4 *)p_forward;
  _grad_x = *(_Hash_node_base **)(p_forward + 8);
  grad_y = *(uint32_t *)(p_forward + 0x2c);
  bias = *(uint32_t *)(p_forward + 0x24);
  constexpr_sampler._4_4_ = *(uint32_t *)(p_forward + 0x28);
  constexpr_sampler._0_4_ = *(uint32_t *)(p_forward + 0x38);
  _Stack_50._M_nxt = (_Hash_node_base *)0x0;
  var._7_1_ = 0;
  _auStack_28 = in_RCX;
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
  uStack_60 = Compiler::maybe_get_backing_variable((Compiler *)args,uVar4);
  if ((SPIRFunction *)uStack_60 != (SPIRFunction *)0x0) {
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)
                       ((long)&(((SPIRFunction *)uStack_60)->arguments).
                               super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr + 4));
    if (uVar4 == 0) {
      TypedID<(spirv_cross::Types)2>::TypedID(&local_64,(ID *)(uStack_60 + 8));
    }
    else {
      local_64.id = ((VariableID *)(uStack_60 + 0x1c))->id;
    }
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_64);
    _Stack_50._M_nxt = (_Hash_node_base *)find_constexpr_sampler((CompilerMSL *)args,uVar4);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)(uStack_60 + 8));
    var._7_1_ = Compiler::has_extended_decoration
                          ((Compiler *)args,uVar4,SPIRVCrossDecorationDynamicImageSampler);
  }
  local_65 = '\0';
  ::std::__cxx11::string::string((string *)this);
  local_66 = 1;
  target_type = (BaseType)args;
  if ((var._7_1_ & 1) == 0) {
    bVar2 = needs_chroma_reconstruction((MSLConstexprSampler *)_Stack_50._M_nxt);
    if (bVar2) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
      CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_98,target_type,SUB41(uVar4,0));
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_98);
      ::std::__cxx11::string::~string((string *)local_98);
      for (local_9c = AddressingModelPhysical32;
          local_9c < *(AddressingModel *)(_Stack_50._M_nxt + 6);
          local_9c = local_9c + AddressingModelPhysical32) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
        CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)&combined,target_type,SUB41(uVar4,0))
        ;
        join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                  (local_c0,(char (*) [3])0x4f06f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&combined,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &args[0x80].sample,&local_9c);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_c0);
        ::std::__cxx11::string::~string((string *)local_c0);
        ::std::__cxx11::string::~string((string *)&combined);
      }
    }
    else if (((((MSLConstexprSampler *)_Stack_50._M_nxt == (MSLConstexprSampler *)0x0) ||
              ((*(bool *)((long)(_Stack_50._M_nxt + 0xc) + 3) & 1U) == 0)) &&
             ((args[0x76].base.field_0x15 & 1) != 0)) && ((p_forward[0x11] & 1U) != 0)) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
      local_108._32_8_ =
           Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>((Compiler *)args,uVar4);
      if ((SPIRFunction *)local_108._32_8_ == (SPIRFunction *)0x0) {
        local_1298 = (TypedID *)((long)&imgtype + 4);
      }
      else {
        local_1298 = (TypedID *)&((SPIRFunction *)local_108._32_8_)->function_type;
      }
      uVar4 = TypedID::operator_cast_to_unsigned_int(local_1298);
      CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_108,target_type,SUB41(uVar4,0));
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_108);
      ::std::__cxx11::string::~string((string *)local_108);
    }
    if ((p_forward[0x10] & 1U) == 0) {
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        ::std::__cxx11::string::operator+=((string *)this,", ");
      }
      TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
      to_sampler_expression_abi_cxx11_((CompilerMSL *)local_128,target_type);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_128);
      ::std::__cxx11::string::~string((string *)local_128);
    }
    if ((((MSLConstexprSampler *)_Stack_50._M_nxt == (MSLConstexprSampler *)0x0) ||
        ((*(bool *)((long)(_Stack_50._M_nxt + 0xc) + 3) & 1U) == 0)) &&
       (((args[0x76].base.field_0x15 & 1) != 0 && ((p_forward[0x11] & 1U) != 0)))) {
      TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
      to_swizzle_expression_abi_cxx11_((CompilerMSL *)local_168,target_type);
      ::std::operator+(local_168 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f06f8
                      );
      ::std::__cxx11::string::operator+=((string *)this,(string *)(local_168 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_168 + 0x20));
      ::std::__cxx11::string::~string((string *)local_168);
      *(undefined1 *)((long)&args[0x7d].grad_y + 2) = 1;
    }
    if ((*(int *)(p_forward + 0x3c) != 0) && ((args[0x76].base.field_0x15 & 1) != 0)) {
      local_66 = CompilerGLSL::should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x3c));
      to_component_argument_abi_cxx11_((CompilerMSL *)local_1a8,target_type);
      ::std::operator+(local_1a8 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f06f8
                      );
      ::std::__cxx11::string::operator+=((string *)this,(string *)(local_1a8 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_1a8 + 0x20));
      ::std::__cxx11::string::~string((string *)local_1a8);
    }
  }
  local_12a6 = false;
  if ((local_66 & 1) != 0) {
    local_12a6 = CompilerGLSL::should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x18));
  }
  local_66 = local_12a6;
  CompilerGLSL::to_enclosed_expression_abi_cxx11_
            ((CompilerGLSL *)&coord_type,target_type,SUB41(*(undefined4 *)(p_forward + 0x18),0));
  type_00 = Compiler::expression_type((Compiler *)args,*(uint32_t *)(p_forward + 0x18));
  type_is_floating_point(type_00);
  bVar2 = false;
  ::std::__cxx11::string::string(local_1f8,(string *)&coord_type);
  local_240._68_4_ = 0;
  switch(*(undefined4 *)((long)(_grad_x + 0x1f) + 4)) {
  case 0:
    if (1 < type_00->vecsize) {
      CompilerGLSL::enclose_expression((CompilerGLSL *)local_240,(string *)args);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_240 + 0x20),local_240);
      ::std::__cxx11::string::operator=(local_1f8,(string *)(local_240 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_240 + 0x20));
      ::std::__cxx11::string::~string((string *)local_240);
    }
    if ((p_forward[0x10] & 1U) == 0) {
      bVar3 = sampling_type_needs_f32_conversion(type_00);
      if (bVar3) {
        convert_to_f32((CompilerMSL *)local_2e0,(string *)args,(uint32_t)local_1f8);
        ::std::__cxx11::string::operator=(local_1f8,(string *)local_2e0);
        ::std::__cxx11::string::~string((string *)local_2e0);
      }
    }
    else {
      ::std::__cxx11::string::string((string *)(local_2e0 + 0x20),local_1f8);
      round_fp_tex_coords((CompilerMSL *)local_2a0,(string *)args,(bool)((char)local_2e0 + ' '));
      ::std::operator+(local_2a0 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f101e
                      );
      ::std::operator+(local_260,local_2a0 + 0x20);
      ::std::__cxx11::string::operator=(local_1f8,(string *)local_260);
      ::std::__cxx11::string::~string((string *)local_260);
      ::std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
      ::std::__cxx11::string::~string((string *)local_2a0);
      ::std::__cxx11::string::~string((string *)(local_2e0 + 0x20));
    }
    if ((args[0x76].coord & 0x1000000) != 0) {
      if ((p_forward[0x10] & 1U) == 0) {
        ::std::operator+((char *)local_360,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "float2(");
        ::std::operator+(local_340,(char *)local_360);
        ::std::__cxx11::string::operator=(local_1f8,(string *)local_340);
        ::std::__cxx11::string::~string((string *)local_340);
        ::std::__cxx11::string::~string(local_360);
      }
      else {
        ::std::operator+((char *)local_320,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "uint2(");
        ::std::operator+(local_300,(char *)local_320);
        ::std::__cxx11::string::operator=(local_1f8,(string *)local_300);
        ::std::__cxx11::string::~string((string *)local_300);
        ::std::__cxx11::string::~string(local_320);
      }
    }
    local_240._68_4_ = 1;
    break;
  case 1:
    if (2 < type_00->vecsize) {
      CompilerGLSL::enclose_expression((CompilerGLSL *)local_5c0,(string *)args);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_5c0 + 0x20),local_5c0);
      ::std::__cxx11::string::operator=(local_1f8,(string *)(local_5c0 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_5c0 + 0x20));
      ::std::__cxx11::string::~string((string *)local_5c0);
    }
    if ((p_forward[0x10] & 1U) == 0) {
      bVar3 = sampling_type_needs_f32_conversion(type_00);
      if (bVar3) {
        convert_to_f32((CompilerMSL *)local_660,(string *)args,(uint32_t)local_1f8);
        ::std::__cxx11::string::operator=(local_1f8,(string *)local_660);
        ::std::__cxx11::string::~string((string *)local_660);
      }
    }
    else {
      ::std::__cxx11::string::string((string *)(local_660 + 0x20),local_1f8);
      round_fp_tex_coords((CompilerMSL *)local_620,(string *)args,(bool)((char)local_660 + ' '));
      ::std::operator+(local_620 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"uint2("
                      );
      ::std::operator+(local_5e0,local_620 + 0x20);
      ::std::__cxx11::string::operator=(local_1f8,(string *)local_5e0);
      ::std::__cxx11::string::~string((string *)local_5e0);
      ::std::__cxx11::string::~string((string *)(local_620 + 0x20));
      ::std::__cxx11::string::~string((string *)local_620);
      ::std::__cxx11::string::~string((string *)(local_660 + 0x20));
    }
    local_240._68_4_ = 2;
    break;
  case 2:
    if (3 < type_00->vecsize) {
      CompilerGLSL::enclose_expression((CompilerGLSL *)local_6a0,(string *)args);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_6a0 + 0x20),local_6a0);
      ::std::__cxx11::string::operator=(local_1f8,(string *)(local_6a0 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_6a0 + 0x20));
      ::std::__cxx11::string::~string((string *)local_6a0);
    }
    if ((p_forward[0x10] & 1U) == 0) {
      bVar3 = sampling_type_needs_f32_conversion(type_00);
      if (bVar3) {
        convert_to_f32((CompilerMSL *)local_740,(string *)args,(uint32_t)local_1f8);
        ::std::__cxx11::string::operator=(local_1f8,(string *)local_740);
        ::std::__cxx11::string::~string((string *)local_740);
      }
    }
    else {
      ::std::__cxx11::string::string((string *)(local_740 + 0x20),local_1f8);
      round_fp_tex_coords((CompilerMSL *)local_700,(string *)args,(bool)((char)local_740 + ' '));
      ::std::operator+(local_700 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f3fad
                      );
      ::std::operator+(local_6c0,local_700 + 0x20);
      ::std::__cxx11::string::operator=(local_1f8,(string *)local_6c0);
      ::std::__cxx11::string::~string((string *)local_6c0);
      ::std::__cxx11::string::~string((string *)(local_700 + 0x20));
      ::std::__cxx11::string::~string((string *)local_700);
      ::std::__cxx11::string::~string((string *)(local_740 + 0x20));
    }
    local_240._68_4_ = 3;
    break;
  case 3:
    if ((p_forward[0x10] & 1U) == 0) {
      if (3 < type_00->vecsize) {
        CompilerGLSL::enclose_expression((CompilerGLSL *)local_800,(string *)args);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_800 + 0x20),local_800);
        ::std::__cxx11::string::operator=(local_1f8,(string *)(local_800 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_800 + 0x20));
        ::std::__cxx11::string::~string((string *)local_800);
      }
    }
    else {
      bVar2 = true;
      ::std::__cxx11::string::operator+=(local_1f8,".xy");
      ::std::__cxx11::string::string(local_7c0,local_1f8);
      round_fp_tex_coords((CompilerMSL *)local_7a0,(string *)args,SUB81(local_7c0,0));
      ::std::operator+(local_7a0 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"uint2("
                      );
      ::std::operator+(local_760,local_7a0 + 0x20);
      ::std::__cxx11::string::operator=(local_1f8,(string *)local_760);
      ::std::__cxx11::string::~string((string *)local_760);
      ::std::__cxx11::string::~string((string *)(local_7a0 + 0x20));
      ::std::__cxx11::string::~string((string *)local_7a0);
      ::std::__cxx11::string::~string(local_7c0);
    }
    bVar3 = sampling_type_needs_f32_conversion(type_00);
    if (bVar3) {
      convert_to_f32((CompilerMSL *)&type,(string *)args,(uint32_t)local_1f8);
      ::std::__cxx11::string::operator=(local_1f8,(string *)&type);
      ::std::__cxx11::string::~string((string *)&type);
    }
    local_240._68_4_ = 3;
    break;
  default:
    break;
  case 5:
    if (1 < type_00->vecsize) {
      CompilerGLSL::enclose_expression((CompilerGLSL *)local_3a0,(string *)args);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_3a0 + 0x20),local_3a0);
      ::std::__cxx11::string::operator=(local_1f8,(string *)(local_3a0 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_3a0 + 0x20));
      ::std::__cxx11::string::~string((string *)local_3a0);
    }
    if ((args[0x76].grad_x & 1) == 0) {
      if ((p_forward[0x10] & 1U) != 0) {
        if (args[0x75].grad_x == 0) {
          ::std::__cxx11::string::string((string *)(local_580 + 0x20),local_1f8);
          round_fp_tex_coords((CompilerMSL *)local_540,(string *)args,(bool)((char)local_580 + ' '))
          ;
          ::std::operator+(local_540 + 0x20,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "spvTexelBufferCoord(");
          ::std::operator+(local_500,local_540 + 0x20);
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
          CompilerGLSL::to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_580,target_type,SUB41(uVar4,0));
          ::std::operator+(local_4e0,local_500);
          ::std::operator+(local_4c0,(char *)local_4e0);
          ::std::__cxx11::string::operator=(local_1f8,(string *)local_4c0);
          ::std::__cxx11::string::~string((string *)local_4c0);
          ::std::__cxx11::string::~string((string *)local_4e0);
          ::std::__cxx11::string::~string((string *)local_580);
          ::std::__cxx11::string::~string((string *)local_500);
          ::std::__cxx11::string::~string((string *)(local_540 + 0x20));
          ::std::__cxx11::string::~string((string *)local_540);
          ::std::__cxx11::string::~string((string *)(local_580 + 0x20));
        }
        else {
          ::std::__cxx11::string::string(local_4a0,local_1f8);
          round_fp_tex_coords((CompilerMSL *)local_480,(string *)args,SUB81(local_4a0,0));
          ::std::operator+(local_480 + 0x20,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "spvTexelBufferCoord(");
          ::std::operator+(local_440,local_480 + 0x20);
          ::std::__cxx11::string::operator=(local_1f8,(string *)local_440);
          ::std::__cxx11::string::~string((string *)local_440);
          ::std::__cxx11::string::~string((string *)(local_480 + 0x20));
          ::std::__cxx11::string::~string((string *)local_480);
          ::std::__cxx11::string::~string(local_4a0);
        }
      }
    }
    else {
      ::std::__cxx11::string::string(local_420,local_1f8);
      round_fp_tex_coords((CompilerMSL *)local_400,(string *)args,SUB81(local_420,0));
      ::std::operator+(local_400 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f101e
                      );
      ::std::operator+(local_3c0,local_400 + 0x20);
      ::std::__cxx11::string::operator=(local_1f8,(string *)local_3c0);
      ::std::__cxx11::string::~string((string *)local_3c0);
      ::std::__cxx11::string::~string((string *)(local_400 + 0x20));
      ::std::__cxx11::string::~string((string *)local_400);
      ::std::__cxx11::string::~string(local_420);
    }
    local_240._68_4_ = 1;
    break;
  case 6:
    ::std::__cxx11::string::operator=(local_1f8,"uint2(gl_FragCoord.xy)");
    local_240._68_4_ = 2;
  }
  if (((p_forward[0x10] & 1U) == 0) || (*(int *)(p_forward + 0x34) == 0)) {
    if (((p_forward[0x10] & 1U) != 0) && (*(int *)(p_forward + 0x30) != 0)) {
      local_12d9 = false;
      if ((local_66 & 1) != 0) {
        local_12d9 = CompilerGLSL::should_forward
                               ((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x30));
      }
      local_66 = local_12d9;
      local_8b0 = Compiler::expression_type((Compiler *)args,*(uint32_t *)(p_forward + 0x30));
      if (*(int *)&(local_8b0->super_IVariant).field_0xc == 8) {
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  ((CompilerGLSL *)local_930,target_type,SUB41(*(undefined4 *)(p_forward + 0x30),0))
        ;
        ::std::operator+(local_930 + 0x20,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x4f3a30);
        ::std::__cxx11::string::operator+=(local_1f8,(string *)(local_930 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_930 + 0x20));
        ::std::__cxx11::string::~string((string *)local_930);
      }
      else {
        CompilerGLSL::bitcast_expression_abi_cxx11_((CompilerGLSL *)local_8f0,target_type,8);
        ::std::operator+(local_8f0 + 0x20,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x4f3a30);
        ::std::__cxx11::string::operator+=(local_1f8,(string *)(local_8f0 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_8f0 + 0x20));
        ::std::__cxx11::string::~string((string *)local_8f0);
      }
    }
  }
  else {
    local_12cc = false;
    if ((local_66 & 1) != 0) {
      local_12cc = CompilerGLSL::should_forward
                             ((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x34));
    }
    local_66 = local_12cc;
    local_828._M_nxt =
         (_Hash_node_base *)
         Compiler::expression_type((Compiler *)args,*(uint32_t *)(p_forward + 0x34));
    if (*(int *)&(((SPIRType *)local_828._M_nxt)->super_IVariant).field_0xc == 8) {
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                ((CompilerGLSL *)&type_1,target_type,SUB41(*(undefined4 *)(p_forward + 0x34),0));
      ::std::operator+((char *)local_888,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f3a30
                      );
      ::std::__cxx11::string::operator+=(local_1f8,local_888);
      ::std::__cxx11::string::~string(local_888);
      ::std::__cxx11::string::~string((string *)&type_1);
    }
    else {
      CompilerGLSL::bitcast_expression_abi_cxx11_((CompilerGLSL *)local_868,target_type,8);
      ::std::operator+(local_868 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f3a30
                      );
      ::std::__cxx11::string::operator+=(local_1f8,(string *)(local_868 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_868 + 0x20));
      ::std::__cxx11::string::~string((string *)local_868);
    }
  }
  if ((p_forward[0x12] & 1U) != 0) {
    bVar3 = sampling_type_needs_f32_conversion(type_00);
    if (bVar3) {
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                ((CompilerGLSL *)local_990,target_type,*(uint32_t *)(p_forward + 0x18));
      convert_to_f32((CompilerMSL *)local_970,(string *)args,(uint32_t)local_990);
      ::std::operator+(local_970 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4e4944
                      );
      ::std::__cxx11::string::operator+=(local_1f8,(string *)(local_970 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_970 + 0x20));
      ::std::__cxx11::string::~string((string *)local_970);
      ::std::__cxx11::string::~string((string *)local_990);
    }
    else {
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                ((CompilerGLSL *)local_9d0,target_type,*(uint32_t *)(p_forward + 0x18));
      ::std::operator+(local_9d0 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4e4944
                      );
      ::std::__cxx11::string::operator+=(local_1f8,(string *)(local_9d0 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_9d0 + 0x20));
      ::std::__cxx11::string::~string((string *)local_9d0);
    }
  }
  uVar5 = ::std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    ::std::__cxx11::string::operator+=((string *)this,", ");
  }
  if (((*(int *)((long)(_grad_x + 0x1f) + 4) == 3) &&
      ((*(char *)((long)(_grad_x + 0x20) + 1) & 1U) != 0)) && ((args[0x76].dref & 0x10000) != 0)) {
    ::std::operator+((char *)local_a10,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f102b);
    ::std::operator+(local_9f0,(char *)local_a10);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_9f0);
    ::std::__cxx11::string::~string((string *)local_9f0);
    ::std::__cxx11::string::~string(local_a10);
    if (bVar2) {
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                ((CompilerGLSL *)local_a70,target_type,*(uint32_t *)(p_forward + 0x18));
      ::std::operator+(local_a70 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ", uint(");
      ::std::operator+(local_a30,local_a70 + 0x20);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_a30);
      ::std::__cxx11::string::~string((string *)local_a30);
      ::std::__cxx11::string::~string((string *)(local_a70 + 0x20));
      ::std::__cxx11::string::~string((string *)local_a70);
    }
    else {
      ::std::operator+(local_b10 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ", uint(spvCubemapTo2DArrayFace(");
      ::std::operator+(local_ad0,local_b10 + 0x20);
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                ((CompilerGLSL *)local_b30,target_type,*(uint32_t *)(p_forward + 0x18));
      round_fp_tex_coords((CompilerMSL *)local_b10,(string *)args,SUB81(local_b30,0));
      ::std::operator+(local_ab0,local_ad0);
      ::std::operator+(local_a90,(char *)local_ab0);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_a90);
      ::std::__cxx11::string::~string((string *)local_a90);
      ::std::__cxx11::string::~string((string *)local_ab0);
      ::std::__cxx11::string::~string((string *)local_b10);
      ::std::__cxx11::string::~string((string *)local_b30);
      ::std::__cxx11::string::~string((string *)local_ad0);
      ::std::__cxx11::string::~string((string *)(local_b10 + 0x20));
    }
    add_spv_func_and_recompile((CompilerMSL *)args,SPVFuncImplCubemapTo2DArrayFace);
  }
  else {
    ::std::__cxx11::string::operator+=((string *)this,local_1f8);
    if (bVar2) {
      if ((*(char *)((long)(_grad_x + 0x20) + 1) & 1U) == 0) {
        CompilerGLSL::to_extract_component_expression_abi_cxx11_
                  ((CompilerGLSL *)local_c10,target_type,*(uint32_t *)(p_forward + 0x18));
        round_fp_tex_coords((CompilerMSL *)local_bf0,(string *)args,SUB81(local_c10,0));
        ::std::operator+(local_bf0 + 0x20,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ", uint(");
        ::std::operator+(local_bb0,local_bf0 + 0x20);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_bb0);
        ::std::__cxx11::string::~string((string *)local_bb0);
        ::std::__cxx11::string::~string((string *)(local_bf0 + 0x20));
        ::std::__cxx11::string::~string((string *)local_bf0);
        ::std::__cxx11::string::~string((string *)local_c10);
      }
      else {
        CompilerGLSL::to_extract_component_expression_abi_cxx11_
                  ((CompilerGLSL *)local_b90,target_type,*(uint32_t *)(p_forward + 0x18));
        ::std::operator+(local_b90 + 0x20,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ", uint(");
        ::std::operator+(local_b50,local_b90 + 0x20);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_b50);
        ::std::__cxx11::string::~string((string *)local_b50);
        ::std::__cxx11::string::~string((string *)(local_b90 + 0x20));
        ::std::__cxx11::string::~string((string *)local_b90);
      }
    }
    if ((*(char *)((long)(_grad_x + 0x20) + 1) & 1U) == 0) {
      if (*(int *)((long)(_grad_x + 0x1f) + 4) == 6) {
        if ((args[0x76].base.field_0x17 & 1) == 0) {
          if ((args[0x76].grad_y & 0x10000) != 0) {
            ::std::__cxx11::string::operator+=((string *)this,", gl_Layer");
          }
        }
        else {
          ::std::__cxx11::string::operator+=((string *)this,", gl_ViewIndex");
        }
      }
    }
    else if ((*(int *)((long)(_grad_x + 0x1f) + 4) == 3) && ((p_forward[0x10] & 1U) != 0)) {
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                ((CompilerGLSL *)local_c70,target_type,*(uint32_t *)(p_forward + 0x18));
      ::std::operator+(local_c70 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ", uint(");
      ::std::operator+(local_c30,local_c70 + 0x20);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_c30);
      ::std::__cxx11::string::~string((string *)local_c30);
      ::std::__cxx11::string::~string((string *)(local_c70 + 0x20));
      ::std::__cxx11::string::~string((string *)local_c70);
    }
    else {
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                ((CompilerGLSL *)&dref_type,target_type,*(uint32_t *)(p_forward + 0x18));
      round_fp_tex_coords((CompilerMSL *)local_cd0,(string *)args,SUB81(&dref_type,0));
      ::std::operator+(local_cd0 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ", uint(");
      ::std::operator+(local_c90,local_cd0 + 0x20);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_c90);
      ::std::__cxx11::string::~string((string *)local_c90);
      ::std::__cxx11::string::~string((string *)(local_cd0 + 0x20));
      ::std::__cxx11::string::~string((string *)local_cd0);
      ::std::__cxx11::string::~string((string *)&dref_type);
      if (*(int *)((long)(_grad_x + 0x1f) + 4) == 6) {
        if ((args[0x76].base.field_0x17 & 1) == 0) {
          if ((args[0x76].grad_y & 0x10000) != 0) {
            ::std::__cxx11::string::operator+=((string *)this," + gl_Layer");
          }
        }
        else {
          ::std::__cxx11::string::operator+=((string *)this," + gl_ViewIndex");
        }
      }
    }
  }
  if (*(int *)(p_forward + 0x20) != 0) {
    local_12ea = false;
    if ((local_66 & 1) != 0) {
      local_12ea = CompilerGLSL::should_forward
                             ((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x20));
    }
    local_66 = local_12ea;
    ::std::__cxx11::string::operator+=((string *)this,", ");
    type_01 = Compiler::expression_type((Compiler *)args,*(uint32_t *)(p_forward + 0x20));
    ::std::__cxx11::string::string(local_d18);
    if ((p_forward[0x12] & 1U) == 0) {
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_d98,target_type,SUB41(*(undefined4 *)(p_forward + 0x20),0));
      ::std::__cxx11::string::operator=(local_d18,(string *)local_d98);
      ::std::__cxx11::string::~string((string *)local_d98);
    }
    else {
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                ((CompilerGLSL *)local_d58,target_type,SUB41(*(undefined4 *)(p_forward + 0x20),0));
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                ((CompilerGLSL *)local_d78,target_type,*(uint32_t *)(p_forward + 0x18));
      join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string>
                ((spirv_cross *)(local_d58 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d58,
                 (char (*) [4])0x4e4944,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d78);
      ::std::__cxx11::string::operator=(local_d18,(string *)(local_d58 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_d58 + 0x20));
      ::std::__cxx11::string::~string((string *)local_d78);
      ::std::__cxx11::string::~string((string *)local_d58);
    }
    bVar2 = sampling_type_needs_f32_conversion(type_01);
    if (bVar2) {
      convert_to_f32((CompilerMSL *)local_db8,(string *)args,(uint32_t)local_d18);
      ::std::__cxx11::string::operator=(local_d18,(string *)local_db8);
      ::std::__cxx11::string::~string((string *)local_db8);
    }
    ::std::__cxx11::string::operator+=((string *)this,local_d18);
    bVar2 = Options::is_macos((Options *)&args[0x75].coord_components);
    if ((bVar2) && ((bias != 0 || (constexpr_sampler._4_4_ != 0)))) {
      local_12fb = true;
      if (bias != 0) {
        local_12fb = CompilerGLSL::expression_is_constant_null((CompilerGLSL *)args,bias);
      }
      local_db9 = local_12fb;
      local_12fd = true;
      if (constexpr_sampler._4_4_ != 0) {
        local_12fd = CompilerGLSL::expression_is_constant_null
                               ((CompilerGLSL *)args,constexpr_sampler._4_4_);
      }
      local_dba = local_12fd;
      if (((local_db9 & 1U) == 0) || (local_12fd == false)) {
        local_de2 = '\x01';
        pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_de0,
                   "Using non-constant 0.0 gradient() qualifier for sample_compare. This is not supported in MSL macOS."
                   ,&local_de1);
        CompilerError::CompilerError(pCVar6,(string *)local_de0);
        local_de2 = '\0';
        __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      grad_y = 0;
      bias = 0;
      constexpr_sampler._4_4_ = 0;
      ::std::__cxx11::string::operator+=((string *)this,", level(0)");
    }
    bVar2 = Options::is_macos((Options *)&args[0x75].coord_components);
    if ((bVar2) && ((uint32_t)constexpr_sampler != 0)) {
      bVar2 = CompilerGLSL::expression_is_constant_null
                        ((CompilerGLSL *)args,(uint32_t)constexpr_sampler);
      if (!bVar2) {
        local_e0a = '\x01';
        pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_e08,
                   "Using non-constant 0.0 bias() qualifier for sample_compare. This is not supported in MSL macOS."
                   ,&local_e09);
        CompilerError::CompilerError(pCVar6,(string *)local_e08);
        local_e0a = '\0';
        __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      constexpr_sampler._0_4_ = 0;
    }
    ::std::__cxx11::string::~string(local_d18);
  }
  if (((uint32_t)constexpr_sampler != 0) &&
     ((*(int *)((long)(_grad_x + 0x1f) + 4) != 0 || ((args[0x76].coord & 0x1000000) != 0)))) {
    local_1329 = false;
    if ((local_66 & 1) != 0) {
      local_1329 = CompilerGLSL::should_forward((CompilerGLSL *)args,(uint32_t)constexpr_sampler);
    }
    local_66 = local_1329;
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)local_e70,target_type,SUB41((uint32_t)constexpr_sampler,0));
    ::std::operator+(local_e70 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", bias(")
    ;
    ::std::operator+(local_e30,local_e70 + 0x20);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_e30);
    ::std::__cxx11::string::~string((string *)local_e30);
    ::std::__cxx11::string::~string((string *)(local_e70 + 0x20));
    ::std::__cxx11::string::~string((string *)local_e70);
  }
  if ((grad_y == 0) ||
     ((*(int *)((long)(_grad_x + 0x1f) + 4) == 0 && ((args[0x76].coord & 0x1000000) == 0)))) {
    if (((p_forward[0x10] & 1U) != 0) &&
       (((grad_y == 0 &&
         (((*(int *)((long)(_grad_x + 0x1f) + 4) != 0 || ((args[0x76].coord & 0x1000000) != 0)) &&
          (*(int *)((long)(_grad_x + 0x1f) + 4) != 5)))) &&
        (((*(char *)((long)(_grad_x + 0x20) + 2) & 1U) == 0 &&
         (*(int *)((long)(_grad_x + 0x20) + 4) != 2)))))) {
      ::std::__cxx11::string::operator+=((string *)this,", 0");
    }
  }
  else {
    local_132b = false;
    if ((local_66 & 1) != 0) {
      local_132b = CompilerGLSL::should_forward((CompilerGLSL *)args,grad_y);
    }
    local_66 = local_132b;
    if ((p_forward[0x10] & 1U) == 0) {
      CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_f10,target_type,SUB41(grad_y,0));
      ::std::operator+(local_f10 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ", level(");
      ::std::operator+(local_ed0,local_f10 + 0x20);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_ed0);
      ::std::__cxx11::string::~string((string *)local_ed0);
      ::std::__cxx11::string::~string((string *)(local_f10 + 0x20));
      ::std::__cxx11::string::~string((string *)local_f10);
    }
    else {
      CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_eb0,target_type,SUB41(grad_y,0));
      ::std::operator+(local_eb0 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f06f8
                      );
      ::std::__cxx11::string::operator+=((string *)this,(string *)(local_eb0 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_eb0 + 0x20));
      ::std::__cxx11::string::~string((string *)local_eb0);
    }
  }
  if (((bias != 0) || (constexpr_sampler._4_4_ != 0)) &&
     ((*(int *)((long)(_grad_x + 0x1f) + 4) != 0 || ((args[0x76].coord & 0x1000000) != 0)))) {
    local_132d = false;
    if ((local_66 & 1) != 0) {
      local_132d = CompilerGLSL::should_forward((CompilerGLSL *)args,bias);
    }
    local_66 = local_132d;
    local_132f = false;
    if (local_132d != false) {
      local_132f = CompilerGLSL::should_forward((CompilerGLSL *)args,constexpr_sampler._4_4_);
    }
    local_66 = local_132f;
    ::std::__cxx11::string::string(local_f30);
    iVar1 = *(int *)((long)(_grad_x + 0x1f) + 4);
    if (iVar1 == 1) {
      ::std::__cxx11::string::operator=(local_f30,"2d");
    }
    else if (iVar1 == 2) {
      ::std::__cxx11::string::operator=(local_f30,"3d");
    }
    else if (iVar1 == 3) {
      if (((*(char *)((long)(_grad_x + 0x20) + 1) & 1U) == 0) || ((args[0x76].dref & 0x10000) == 0))
      {
        ::std::__cxx11::string::operator=(local_f30,"cube");
      }
      else {
        ::std::__cxx11::string::operator=(local_f30,"2d");
      }
    }
    else {
      ::std::__cxx11::string::operator=(local_f30,"unsupported_gradient_dimension");
    }
    ::std::operator+(local_1010 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ", gradient");
    ::std::operator+(local_fd0,local_1010 + 0x20);
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_1010,target_type,SUB41(bias,0));
    ::std::operator+(local_fb0,local_fd0);
    ::std::operator+(local_f90,(char *)local_fb0);
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)local_1030,target_type,SUB41(constexpr_sampler._4_4_,0));
    ::std::operator+(local_f70,local_f90);
    ::std::operator+(local_f50,(char *)local_f70);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_f50);
    ::std::__cxx11::string::~string((string *)local_f50);
    ::std::__cxx11::string::~string((string *)local_f70);
    ::std::__cxx11::string::~string((string *)local_1030);
    ::std::__cxx11::string::~string((string *)local_f90);
    ::std::__cxx11::string::~string((string *)local_fb0);
    ::std::__cxx11::string::~string((string *)local_1010);
    ::std::__cxx11::string::~string((string *)local_fd0);
    ::std::__cxx11::string::~string((string *)(local_1010 + 0x20));
    ::std::__cxx11::string::~string(local_f30);
  }
  if (*(int *)(p_forward + 0x48) != 0) {
    bVar2 = Options::is_macos((Options *)&args[0x75].coord_components);
    if (bVar2) {
      bVar2 = Options::supports_msl_version((Options *)&args[0x75].coord_components,2,2,0);
      if (!bVar2) {
        local_1052 = '\x01';
        pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1050,"min_lod_clamp() is only supported in MSL 2.2+ and up on macOS.",
                   &local_1051);
        CompilerError::CompilerError(pCVar6,(string *)local_1050);
        local_1052 = '\0';
        __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    }
    else {
      bVar2 = Options::is_ios((Options *)&args[0x75].coord_components);
      if (bVar2) {
        local_107a = '\x01';
        pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1078,"min_lod_clamp() is not supported on iOS.",&local_1079);
        CompilerError::CompilerError(pCVar6,(string *)local_1078);
        local_107a = '\0';
        __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    }
    local_1361 = false;
    if ((local_66 & 1) != 0) {
      local_1361 = CompilerGLSL::should_forward
                             ((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x48));
    }
    local_66 = local_1361;
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)local_10e0,target_type,SUB41(*(undefined4 *)(p_forward + 0x48),0));
    ::std::operator+(local_10e0 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ", min_lod_clamp(");
    ::std::operator+(local_10a0,local_10e0 + 0x20);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_10a0);
    ::std::__cxx11::string::~string((string *)local_10a0);
    ::std::__cxx11::string::~string((string *)(local_10e0 + 0x20));
    ::std::__cxx11::string::~string((string *)local_10e0);
  }
  ::std::__cxx11::string::string((string *)(local_1120 + 0x20));
  if ((*(int *)(p_forward + 0x30) == 0) || ((p_forward[0x10] & 1U) != 0)) {
    if ((*(int *)(p_forward + 0x34) != 0) && ((p_forward[0x10] & 1U) == 0)) {
      local_1365 = false;
      if ((local_66 & 1) != 0) {
        local_1365 = CompilerGLSL::should_forward
                               ((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x34));
      }
      local_66 = local_1365;
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_1140,target_type,SUB41(*(undefined4 *)(p_forward + 0x34),0));
      ::std::__cxx11::string::operator=((string *)(local_1120 + 0x20),(string *)local_1140);
      ::std::__cxx11::string::~string((string *)local_1140);
    }
  }
  else {
    local_1363 = false;
    if ((local_66 & 1) != 0) {
      local_1363 = CompilerGLSL::should_forward
                             ((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x30));
    }
    local_66 = local_1363;
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)local_1120,target_type,SUB41(*(undefined4 *)(p_forward + 0x30),0));
    ::std::__cxx11::string::operator=((string *)(local_1120 + 0x20),(string *)local_1120);
    ::std::__cxx11::string::~string((string *)local_1120);
  }
  uVar5 = ::std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    if (*(int *)((long)(_grad_x + 0x1f) + 4) == 1) {
      if (2 < type_00->vecsize) {
        CompilerGLSL::enclose_expression((CompilerGLSL *)local_1180,(string *)args);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_1180 + 0x20),local_1180);
        ::std::__cxx11::string::operator=
                  ((string *)(local_1120 + 0x20),(string *)(local_1180 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_1180 + 0x20));
        ::std::__cxx11::string::~string((string *)local_1180);
      }
      ::std::operator+((char *)local_11a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f06f8
                      );
      ::std::__cxx11::string::operator+=((string *)this,local_11a0);
      ::std::__cxx11::string::~string(local_11a0);
    }
    else if (*(int *)((long)(_grad_x + 0x1f) + 4) == 2) {
      if (3 < type_00->vecsize) {
        CompilerGLSL::enclose_expression((CompilerGLSL *)local_11e0,(string *)args);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_11e0 + 0x20),local_11e0);
        ::std::__cxx11::string::operator=
                  ((string *)(local_1120 + 0x20),(string *)(local_11e0 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_11e0 + 0x20));
        ::std::__cxx11::string::~string((string *)local_11e0);
      }
      ::std::operator+((char *)local_1200,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f06f8
                      );
      ::std::__cxx11::string::operator+=((string *)this,local_1200);
      ::std::__cxx11::string::~string(local_1200);
    }
  }
  if (*(int *)(p_forward + 0x3c) != 0) {
    if ((*(int *)((long)(_grad_x + 0x1f) + 4) == 1) &&
       (uVar5 = ::std::__cxx11::string::empty(), (uVar5 & 1) != 0)) {
      ::std::__cxx11::string::operator+=((string *)this,", int2(0)");
    }
    if (((args[0x76].base.field_0x15 & 1) == 0) || ((var._7_1_ & 1) != 0)) {
      local_136d = false;
      if ((local_66 & 1) != 0) {
        local_136d = CompilerGLSL::should_forward
                               ((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x3c));
      }
      local_66 = local_136d;
      to_component_argument_abi_cxx11_((CompilerMSL *)local_1240,target_type);
      ::std::operator+(local_1240 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f06f8
                      );
      ::std::__cxx11::string::operator+=((string *)this,(string *)(local_1240 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_1240 + 0x20));
      ::std::__cxx11::string::~string((string *)local_1240);
    }
  }
  if (*(int *)(p_forward + 0x40) != 0) {
    local_136f = false;
    if ((local_66 & 1) != 0) {
      local_136f = CompilerGLSL::should_forward
                             ((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x40));
    }
    local_66 = local_136f;
    ::std::__cxx11::string::operator+=((string *)this,", ");
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)local_1260,target_type,SUB41(*(undefined4 *)(p_forward + 0x40),0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_1260);
    ::std::__cxx11::string::~string((string *)local_1260);
  }
  *(byte *)_auStack_28 = local_66 & 1;
  local_65 = 1;
  ::std::__cxx11::string::~string((string *)(local_1120 + 0x20));
  ::std::__cxx11::string::~string(local_1f8);
  ::std::__cxx11::string::~string((string *)&coord_type);
  if ((local_65 & 1) == 0) {
    ::std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

string CompilerMSL::to_function_args(const TextureFunctionArguments &args, bool *p_forward)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;
	uint32_t lod = args.lod;
	uint32_t grad_x = args.grad_x;
	uint32_t grad_y = args.grad_y;
	uint32_t bias = args.bias;

	const MSLConstexprSampler *constexpr_sampler = nullptr;
	bool is_dynamic_img_sampler = false;
	if (auto *var = maybe_get_backing_variable(img))
	{
		constexpr_sampler = find_constexpr_sampler(var->basevariable ? var->basevariable : VariableID(var->self));
		is_dynamic_img_sampler = has_extended_decoration(var->self, SPIRVCrossDecorationDynamicImageSampler);
	}

	string farg_str;
	bool forward = true;

	if (!is_dynamic_img_sampler)
	{
		// Texture reference (for some cases)
		if (needs_chroma_reconstruction(constexpr_sampler))
		{
			// Multiplanar images need two or three textures.
			farg_str += to_expression(img);
			for (uint32_t i = 1; i < constexpr_sampler->planes; i++)
				farg_str += join(", ", to_expression(img), plane_name_suffix, i);
		}
		else if ((!constexpr_sampler || !constexpr_sampler->ycbcr_conversion_enable) &&
		         msl_options.swizzle_texture_samples && args.base.is_gather)
		{
			auto *combined = maybe_get<SPIRCombinedImageSampler>(img);
			farg_str += to_expression(combined ? combined->image : img);
		}

		// Sampler reference
		if (!args.base.is_fetch)
		{
			if (!farg_str.empty())
				farg_str += ", ";
			farg_str += to_sampler_expression(img);
		}

		if ((!constexpr_sampler || !constexpr_sampler->ycbcr_conversion_enable) &&
		    msl_options.swizzle_texture_samples && args.base.is_gather)
		{
			// Add the swizzle constant from the swizzle buffer.
			farg_str += ", " + to_swizzle_expression(img);
			used_swizzle_buffer = true;
		}

		// Swizzled gather puts the component before the other args, to allow template
		// deduction to work.
		if (args.component && msl_options.swizzle_texture_samples)
		{
			forward = should_forward(args.component);
			farg_str += ", " + to_component_argument(args.component);
		}
	}

	// Texture coordinates
	forward = forward && should_forward(args.coord);
	auto coord_expr = to_enclosed_expression(args.coord);
	auto &coord_type = expression_type(args.coord);
	bool coord_is_fp = type_is_floating_point(coord_type);
	bool is_cube_fetch = false;

	string tex_coords = coord_expr;
	uint32_t alt_coord_component = 0;

	switch (imgtype.image.dim)
	{

	case Dim1D:
		if (coord_type.vecsize > 1)
			tex_coords = enclose_expression(tex_coords) + ".x";

		if (args.base.is_fetch)
			tex_coords = "uint(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		else if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords = convert_to_f32(tex_coords, 1);

		if (msl_options.texture_1D_as_2D)
		{
			if (args.base.is_fetch)
				tex_coords = "uint2(" + tex_coords + ", 0)";
			else
				tex_coords = "float2(" + tex_coords + ", 0.5)";
		}

		alt_coord_component = 1;
		break;

	case DimBuffer:
		if (coord_type.vecsize > 1)
			tex_coords = enclose_expression(tex_coords) + ".x";

		if (msl_options.texture_buffer_native)
		{
			tex_coords = "uint(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		}
		else
		{
			// Metal texel buffer textures are 2D, so convert 1D coord to 2D.
			// Support for Metal 2.1's new texture_buffer type.
			if (args.base.is_fetch)
			{
				if (msl_options.texel_buffer_texture_width > 0)
				{
					tex_coords = "spvTexelBufferCoord(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
				}
				else
				{
					tex_coords = "spvTexelBufferCoord(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ", " +
					             to_expression(img) + ")";
				}
			}
		}

		alt_coord_component = 1;
		break;

	case DimSubpassData:
		// If we're using Metal's native frame-buffer fetch API for subpass inputs,
		// this path will not be hit.
		tex_coords = "uint2(gl_FragCoord.xy)";
		alt_coord_component = 2;
		break;

	case Dim2D:
		if (coord_type.vecsize > 2)
			tex_coords = enclose_expression(tex_coords) + ".xy";

		if (args.base.is_fetch)
			tex_coords = "uint2(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		else if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords = convert_to_f32(tex_coords, 2);

		alt_coord_component = 2;
		break;

	case Dim3D:
		if (coord_type.vecsize > 3)
			tex_coords = enclose_expression(tex_coords) + ".xyz";

		if (args.base.is_fetch)
			tex_coords = "uint3(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		else if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords = convert_to_f32(tex_coords, 3);

		alt_coord_component = 3;
		break;

	case DimCube:
		if (args.base.is_fetch)
		{
			is_cube_fetch = true;
			tex_coords += ".xy";
			tex_coords = "uint2(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		}
		else
		{
			if (coord_type.vecsize > 3)
				tex_coords = enclose_expression(tex_coords) + ".xyz";
		}

		if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords = convert_to_f32(tex_coords, 3);

		alt_coord_component = 3;
		break;

	default:
		break;
	}

	if (args.base.is_fetch && args.offset)
	{
		// Fetch offsets must be applied directly to the coordinate.
		forward = forward && should_forward(args.offset);
		auto &type = expression_type(args.offset);
		if (type.basetype != SPIRType::UInt)
			tex_coords += " + " + bitcast_expression(SPIRType::UInt, args.offset);
		else
			tex_coords += " + " + to_enclosed_expression(args.offset);
	}
	else if (args.base.is_fetch && args.coffset)
	{
		// Fetch offsets must be applied directly to the coordinate.
		forward = forward && should_forward(args.coffset);
		auto &type = expression_type(args.coffset);
		if (type.basetype != SPIRType::UInt)
			tex_coords += " + " + bitcast_expression(SPIRType::UInt, args.coffset);
		else
			tex_coords += " + " + to_enclosed_expression(args.coffset);
	}

	// If projection, use alt coord as divisor
	if (args.base.is_proj)
	{
		if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords += " / " + convert_to_f32(to_extract_component_expression(args.coord, alt_coord_component), 1);
		else
			tex_coords += " / " + to_extract_component_expression(args.coord, alt_coord_component);
	}

	if (!farg_str.empty())
		farg_str += ", ";

	if (imgtype.image.dim == DimCube && imgtype.image.arrayed && msl_options.emulate_cube_array)
	{
		farg_str += "spvCubemapTo2DArrayFace(" + tex_coords + ").xy";

		if (is_cube_fetch)
			farg_str += ", uint(" + to_extract_component_expression(args.coord, 2) + ")";
		else
			farg_str +=
			    ", uint(spvCubemapTo2DArrayFace(" + tex_coords + ").z) + (uint(" +
			    round_fp_tex_coords(to_extract_component_expression(args.coord, alt_coord_component), coord_is_fp) +
			    ") * 6u)";

		add_spv_func_and_recompile(SPVFuncImplCubemapTo2DArrayFace);
	}
	else
	{
		farg_str += tex_coords;

		// If fetch from cube, add face explicitly
		if (is_cube_fetch)
		{
			// Special case for cube arrays, face and layer are packed in one dimension.
			if (imgtype.image.arrayed)
				farg_str += ", uint(" + to_extract_component_expression(args.coord, 2) + ") % 6u";
			else
				farg_str +=
				    ", uint(" + round_fp_tex_coords(to_extract_component_expression(args.coord, 2), coord_is_fp) + ")";
		}

		// If array, use alt coord
		if (imgtype.image.arrayed)
		{
			// Special case for cube arrays, face and layer are packed in one dimension.
			if (imgtype.image.dim == DimCube && args.base.is_fetch)
			{
				farg_str += ", uint(" + to_extract_component_expression(args.coord, 2) + ") / 6u";
			}
			else
			{
				farg_str +=
				    ", uint(" +
				    round_fp_tex_coords(to_extract_component_expression(args.coord, alt_coord_component), coord_is_fp) +
				    ")";
				if (imgtype.image.dim == DimSubpassData)
				{
					if (msl_options.multiview)
						farg_str += " + gl_ViewIndex";
					else if (msl_options.arrayed_subpass_input)
						farg_str += " + gl_Layer";
				}
			}
		}
		else if (imgtype.image.dim == DimSubpassData)
		{
			if (msl_options.multiview)
				farg_str += ", gl_ViewIndex";
			else if (msl_options.arrayed_subpass_input)
				farg_str += ", gl_Layer";
		}
	}

	// Depth compare reference value
	if (args.dref)
	{
		forward = forward && should_forward(args.dref);
		farg_str += ", ";

		auto &dref_type = expression_type(args.dref);

		string dref_expr;
		if (args.base.is_proj)
			dref_expr = join(to_enclosed_expression(args.dref), " / ",
			                 to_extract_component_expression(args.coord, alt_coord_component));
		else
			dref_expr = to_expression(args.dref);

		if (sampling_type_needs_f32_conversion(dref_type))
			dref_expr = convert_to_f32(dref_expr, 1);

		farg_str += dref_expr;

		if (msl_options.is_macos() && (grad_x || grad_y))
		{
			// For sample compare, MSL does not support gradient2d for all targets (only iOS apparently according to docs).
			// However, the most common case here is to have a constant gradient of 0, as that is the only way to express
			// LOD == 0 in GLSL with sampler2DArrayShadow (cascaded shadow mapping).
			// We will detect a compile-time constant 0 value for gradient and promote that to level(0) on MSL.
			bool constant_zero_x = !grad_x || expression_is_constant_null(grad_x);
			bool constant_zero_y = !grad_y || expression_is_constant_null(grad_y);
			if (constant_zero_x && constant_zero_y)
			{
				lod = 0;
				grad_x = 0;
				grad_y = 0;
				farg_str += ", level(0)";
			}
			else
			{
				SPIRV_CROSS_THROW("Using non-constant 0.0 gradient() qualifier for sample_compare. This is not "
				                  "supported in MSL macOS.");
			}
		}

		if (msl_options.is_macos() && bias)
		{
			// Bias is not supported either on macOS with sample_compare.
			// Verify it is compile-time zero, and drop the argument.
			if (expression_is_constant_null(bias))
			{
				bias = 0;
			}
			else
			{
				SPIRV_CROSS_THROW(
				    "Using non-constant 0.0 bias() qualifier for sample_compare. This is not supported in MSL macOS.");
			}
		}
	}

	// LOD Options
	// Metal does not support LOD for 1D textures.
	if (bias && (imgtype.image.dim != Dim1D || msl_options.texture_1D_as_2D))
	{
		forward = forward && should_forward(bias);
		farg_str += ", bias(" + to_expression(bias) + ")";
	}

	// Metal does not support LOD for 1D textures.
	if (lod && (imgtype.image.dim != Dim1D || msl_options.texture_1D_as_2D))
	{
		forward = forward && should_forward(lod);
		if (args.base.is_fetch)
		{
			farg_str += ", " + to_expression(lod);
		}
		else
		{
			farg_str += ", level(" + to_expression(lod) + ")";
		}
	}
	else if (args.base.is_fetch && !lod && (imgtype.image.dim != Dim1D || msl_options.texture_1D_as_2D) &&
	         imgtype.image.dim != DimBuffer && !imgtype.image.ms && imgtype.image.sampled != 2)
	{
		// Lod argument is optional in OpImageFetch, but we require a LOD value, pick 0 as the default.
		// Check for sampled type as well, because is_fetch is also used for OpImageRead in MSL.
		farg_str += ", 0";
	}

	// Metal does not support LOD for 1D textures.
	if ((grad_x || grad_y) && (imgtype.image.dim != Dim1D || msl_options.texture_1D_as_2D))
	{
		forward = forward && should_forward(grad_x);
		forward = forward && should_forward(grad_y);
		string grad_opt;
		switch (imgtype.image.dim)
		{
		case Dim2D:
			grad_opt = "2d";
			break;
		case Dim3D:
			grad_opt = "3d";
			break;
		case DimCube:
			if (imgtype.image.arrayed && msl_options.emulate_cube_array)
				grad_opt = "2d";
			else
				grad_opt = "cube";
			break;
		default:
			grad_opt = "unsupported_gradient_dimension";
			break;
		}
		farg_str += ", gradient" + grad_opt + "(" + to_expression(grad_x) + ", " + to_expression(grad_y) + ")";
	}

	if (args.min_lod)
	{
		if (msl_options.is_macos())
		{
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("min_lod_clamp() is only supported in MSL 2.2+ and up on macOS.");
		}
		else if (msl_options.is_ios())
			SPIRV_CROSS_THROW("min_lod_clamp() is not supported on iOS.");

		forward = forward && should_forward(args.min_lod);
		farg_str += ", min_lod_clamp(" + to_expression(args.min_lod) + ")";
	}

	// Add offsets
	string offset_expr;
	if (args.coffset && !args.base.is_fetch)
	{
		forward = forward && should_forward(args.coffset);
		offset_expr = to_expression(args.coffset);
	}
	else if (args.offset && !args.base.is_fetch)
	{
		forward = forward && should_forward(args.offset);
		offset_expr = to_expression(args.offset);
	}

	if (!offset_expr.empty())
	{
		switch (imgtype.image.dim)
		{
		case Dim2D:
			if (coord_type.vecsize > 2)
				offset_expr = enclose_expression(offset_expr) + ".xy";

			farg_str += ", " + offset_expr;
			break;

		case Dim3D:
			if (coord_type.vecsize > 3)
				offset_expr = enclose_expression(offset_expr) + ".xyz";

			farg_str += ", " + offset_expr;
			break;

		default:
			break;
		}
	}

	if (args.component)
	{
		// If 2D has gather component, ensure it also has an offset arg
		if (imgtype.image.dim == Dim2D && offset_expr.empty())
			farg_str += ", int2(0)";

		if (!msl_options.swizzle_texture_samples || is_dynamic_img_sampler)
		{
			forward = forward && should_forward(args.component);
			farg_str += ", " + to_component_argument(args.component);
		}
	}

	if (args.sample)
	{
		forward = forward && should_forward(args.sample);
		farg_str += ", ";
		farg_str += to_expression(args.sample);
	}

	*p_forward = forward;

	return farg_str;
}